

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O0

void apply_mapping(NS *base,
                  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                  *base_to_template)

{
  N *pNVar1;
  type pNVar2;
  insert_iterator<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  __result;
  insert_iterator<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  __result_00;
  initializer_list<N_*> ns;
  bool bVar3;
  reference ppVar4;
  size_type sVar5;
  runtime_error *this;
  reference ppNVar6;
  reference ppNVar7;
  mapped_type *ppNVar8;
  reference ppVar9;
  _Iter _Var10;
  undefined8 in_RSI;
  insert_iterator<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  iVar11;
  insert_iterator<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  iVar12;
  type *o_3;
  type *p_4;
  iterator __end3_3;
  iterator __begin3_3;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  *__range3_3;
  type *o_2;
  type *p_3;
  iterator __end3_2;
  iterator __begin3_2;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  *__range3_2;
  N *o_1;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> __end4_1;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> __begin4_1;
  nodeit *__range4_1;
  N *p_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<N_*,_std::allocator<N_*>_> *__range3_1;
  N *o;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> __end4;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> __begin4;
  nodeit *__range4;
  N *p_1;
  iterator __end3;
  iterator __begin3;
  vector<N_*,_std::allocator<N_*>_> *__range3;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  added;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  deleted;
  vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> nested_connections;
  vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> template_connections;
  N *nested_n;
  NS **g_1;
  type *base_n_1;
  type *template_n_1;
  iterator __end1_2;
  iterator __begin1_2;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *__range1_2;
  NS **g;
  type *base_n;
  type *template_n;
  iterator __end1_1;
  iterator __begin1_1;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *__range1_1;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> nested_to_template;
  pair<N_*const,_N_*> *p;
  iterator __end1;
  iterator __begin1;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *__range1;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> template_to_base;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_fffffffffffffae8;
  __range_iter_t<std::set<std::pair<N_*,_N_*>_>_> in_stack_fffffffffffffaf0;
  type in_stack_fffffffffffffaf8;
  type in_stack_fffffffffffffb00;
  type in_stack_fffffffffffffb28;
  _Iter in_stack_fffffffffffffb30;
  _Iter in_stack_fffffffffffffb38;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  *in_stack_fffffffffffffb40;
  __normal_iterator<std::pair<N_*,_N_*>_*,_std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  in_stack_fffffffffffffb48;
  __normal_iterator<std::pair<N_*,_N_*>_*,_std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  in_stack_fffffffffffffb50;
  N *in_stack_fffffffffffffb58;
  _Iter in_stack_fffffffffffffb60;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  *in_stack_fffffffffffffb68;
  mapped_type local_410;
  sockaddr *local_408;
  undefined8 local_400;
  type *local_3f8;
  type *local_3f0;
  N *local_3e8;
  N *pNStack_3e0;
  _Self local_3d8;
  _Self local_3d0;
  undefined1 *local_3c8;
  mapped_type local_3c0;
  mapped_type *local_3b8;
  undefined8 local_3b0;
  type *local_3a8;
  type *local_3a0;
  N *local_398;
  N *pNStack_390;
  _Self local_380;
  _Self local_378;
  undefined1 *local_370;
  insert_iterator<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  local_368;
  _Base_ptr local_358;
  insert_iterator<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  local_350;
  pair<N_*,_N_*> *local_340;
  pair<N_*,_N_*> *local_338;
  pair<N_*,_N_*> *local_330;
  pair<N_*,_N_*> *local_328;
  insert_iterator<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  local_320;
  _Base_ptr local_310;
  insert_iterator<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
  local_308;
  pair<N_*,_N_*> *local_2f8;
  pair<N_*,_N_*> *local_2f0;
  pair<N_*,_N_*> *local_2e8;
  pair<N_*,_N_*> *local_2e0;
  N *local_2d8;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_2d0;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_2b0;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_290;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *local_270;
  N *local_268;
  N **local_260;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> local_258;
  vector<N_*,_std::allocator<N_*>_> *local_250;
  N *local_248;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_240;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_220;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_200;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *local_1e0;
  N *local_1d8;
  N **local_1d0;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> local_1c8;
  vector<N_*,_std::allocator<N_*>_> *local_1c0;
  undefined1 local_1b8 [120];
  pair<N_*,_N_*> local_140;
  value_type local_128;
  add_pointer_t<NS_*> local_120;
  type *local_118;
  type *local_110;
  N *local_108;
  N *local_100;
  _Self local_f8;
  _Self local_f0;
  undefined8 local_e8;
  add_pointer_t<NS_*> local_e0;
  type *local_d8;
  type *local_d0;
  N *local_c8;
  N *local_c0;
  _Self local_b8;
  _Self local_b0;
  undefined8 local_a8;
  reference local_60;
  _Self local_58;
  _Self local_50;
  undefined8 local_48;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::map
            ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)0x198f74);
  local_48 = local_10;
  local_50._M_node =
       (_Base_ptr)
       std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::begin
                 ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                  in_stack_fffffffffffffae8);
  local_58._M_node =
       (_Base_ptr)
       std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::end
                 ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                  in_stack_fffffffffffffae8);
  while (bVar3 = std::operator==(&local_50,&local_58), ((bVar3 ^ 0xffU) & 1) != 0) {
    local_60 = std::_Rb_tree_iterator<std::pair<N_*const,_N_*>_>::operator*
                         ((_Rb_tree_iterator<std::pair<N_*const,_N_*>_> *)0x198fdb);
    pNVar1 = local_60->first;
    ppNVar8 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
              operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                          *)in_stack_fffffffffffffb30._M_node,(key_type *)in_stack_fffffffffffffb28)
    ;
    *ppNVar8 = pNVar1;
    std::_Rb_tree_iterator<std::pair<N_*const,_N_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<N_*const,_N_*>_> *)in_stack_fffffffffffffaf0._M_node);
  }
  std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::map
            ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)0x19905c);
  local_a8 = local_10;
  local_b0._M_node =
       (_Base_ptr)
       std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::begin
                 ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                  in_stack_fffffffffffffae8);
  local_b8._M_node =
       (_Base_ptr)
       std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::end
                 ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                  in_stack_fffffffffffffae8);
  while (bVar3 = std::operator==(&local_b0,&local_b8), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<N_*const,_N_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<N_*const,_N_*>_> *)0x1990c3);
    local_c8 = ppVar4->first;
    local_c0 = ppVar4->second;
    local_d0 = std::get<0ul,N*const,N*>((pair<N_*const,_N_*> *)0x1990e7);
    local_d8 = std::get<1ul,N*const,N*>((pair<N_*const,_N_*> *)0x1990fc);
    local_e0 = std::get_if<NS*,std::__cxx11::string,int,double,NS*>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                           *)0x199118);
    if ((local_e0 != (add_pointer_t<NS_*>)0x0) &&
       (sVar5 = std::vector<N_*,_std::allocator<N_*>_>::size(&(*local_e0)->_os), sVar5 == 1)) {
      pNVar2 = *local_d0;
      std::vector<N_*,_std::allocator<N_*>_>::operator[](&(*local_e0)->_os,0);
      ppNVar8 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                            *)in_stack_fffffffffffffb30._M_node,
                           (key_type *)in_stack_fffffffffffffb28);
      *ppNVar8 = pNVar2;
    }
    std::_Rb_tree_iterator<std::pair<N_*const,_N_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<N_*const,_N_*>_> *)in_stack_fffffffffffffaf0._M_node);
  }
  local_e8 = local_10;
  local_f0._M_node =
       (_Base_ptr)
       std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::begin
                 ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                  in_stack_fffffffffffffae8);
  local_f8._M_node =
       (_Base_ptr)
       std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::end
                 ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                  in_stack_fffffffffffffae8);
  iVar11.iter._M_node = in_stack_fffffffffffffb60._M_node;
  iVar11.container = in_stack_fffffffffffffb68;
  iVar12.iter._M_node = in_stack_fffffffffffffb38._M_node;
  iVar12.container = in_stack_fffffffffffffb40;
  do {
    bVar3 = std::operator==(&local_f0,&local_f8);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::~map
                ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                 0x199bdd);
      std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::~map
                ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                 0x199bea);
      return;
    }
    ppVar4 = std::_Rb_tree_iterator<std::pair<N_*const,_N_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<N_*const,_N_*>_> *)0x199231);
    local_108 = ppVar4->first;
    local_100 = ppVar4->second;
    local_110 = std::get<0ul,N*const,N*>((pair<N_*const,_N_*> *)0x199255);
    local_118 = std::get<1ul,N*const,N*>((pair<N_*const,_N_*> *)0x19926a);
    local_120 = std::get_if<NS*,std::__cxx11::string,int,double,NS*>
                          ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                            *)0x199286);
    if (local_120 != (add_pointer_t<NS_*>)0x0) {
      sVar5 = std::vector<N_*,_std::allocator<N_*>_>::size(&(*local_120)->_os);
      if (sVar5 != 1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"Node creation/deletion in rewriting is not yet implemented");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ppNVar6 = std::vector<N_*,_std::allocator<N_*>_>::operator[](&(*local_120)->_os,0);
      local_128 = *ppNVar6;
      std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::vector
                ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)0x19934b);
      std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::vector
                ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)0x199358);
      std::
      set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
      ::set((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
             *)0x199365);
      std::
      set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
      ::set((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
             *)0x199372);
      local_1c0 = &(*local_110)->ps;
      local_1c8._M_current =
           (N **)std::vector<N_*,_std::allocator<N_*>_>::begin
                           ((vector<N_*,_std::allocator<N_*>_> *)in_stack_fffffffffffffae8);
      local_1d0 = (N **)std::vector<N_*,_std::allocator<N_*>_>::end
                                  ((vector<N_*,_std::allocator<N_*>_> *)in_stack_fffffffffffffae8);
      while( true ) {
        bVar3 = __gnu_cxx::operator==<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>
                          ((__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
                           in_stack_fffffffffffffaf0._M_node,&in_stack_fffffffffffffae8->_start);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        ppNVar7 = __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::
                  operator*(&local_1c8);
        local_1d8 = *ppNVar7;
        N::operator[]((N *)iVar11.iter._M_node._M_node,in_stack_fffffffffffffb58);
        local_1e0 = &local_200;
        CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::begin
                  (&local_220,local_1e0);
        CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::end
                  (&local_240,local_1e0);
        while( true ) {
          bVar3 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                  ::operator!=((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                                *)in_stack_fffffffffffffaf0._M_node,in_stack_fffffffffffffae8);
          if (!bVar3) break;
          local_248 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      ::operator*((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                                   *)0x199488);
          std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>::emplace_back<N*&,N*&>
                    ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                     in_stack_fffffffffffffb00,(N **)in_stack_fffffffffffffaf8,
                     (N **)in_stack_fffffffffffffaf0._M_node);
          CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::
          operator++((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      *)in_stack_fffffffffffffaf0._M_node);
        }
        __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::operator++
                  (&local_1c8);
      }
      local_250 = &local_128->ps;
      local_258._M_current =
           (N **)std::vector<N_*,_std::allocator<N_*>_>::begin
                           ((vector<N_*,_std::allocator<N_*>_> *)in_stack_fffffffffffffae8);
      local_260 = (N **)std::vector<N_*,_std::allocator<N_*>_>::end
                                  ((vector<N_*,_std::allocator<N_*>_> *)in_stack_fffffffffffffae8);
      while( true ) {
        bVar3 = __gnu_cxx::operator==<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>
                          ((__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
                           in_stack_fffffffffffffaf0._M_node,&in_stack_fffffffffffffae8->_start);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        ppNVar7 = __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::
                  operator*(&local_258);
        local_268 = *ppNVar7;
        N::operator[]((N *)iVar11.iter._M_node._M_node,in_stack_fffffffffffffb58);
        local_270 = &local_290;
        CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::begin
                  (&local_2b0,local_270);
        CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::end
                  (&local_2d0,local_270);
        while( true ) {
          bVar3 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                  ::operator!=((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                                *)in_stack_fffffffffffffaf0._M_node,in_stack_fffffffffffffae8);
          if (!bVar3) break;
          local_2d8 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      ::operator*((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                                   *)0x199645);
          std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>::emplace_back<N*&,N*&>
                    ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                     in_stack_fffffffffffffb00,(N **)in_stack_fffffffffffffaf8,
                     (N **)in_stack_fffffffffffffaf0._M_node);
          CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::
          operator++((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      *)in_stack_fffffffffffffaf0._M_node);
        }
        __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::operator++
                  (&local_258);
      }
      local_2e0 = (pair<N_*,_N_*> *)
                  std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::begin
                            ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                             in_stack_fffffffffffffae8);
      local_2e8 = (pair<N_*,_N_*> *)
                  std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::end
                            ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                             in_stack_fffffffffffffae8);
      local_2f0 = (pair<N_*,_N_*> *)
                  std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::begin
                            ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                             in_stack_fffffffffffffae8);
      local_2f8 = (pair<N_*,_N_*> *)
                  std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::end
                            ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                             in_stack_fffffffffffffae8);
      local_310 = (_Base_ptr)
                  std::
                  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                  ::begin((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                           *)in_stack_fffffffffffffae8);
      iVar11 = std::
               inserter<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
                         ((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                           *)in_stack_fffffffffffffae8,in_stack_fffffffffffffaf0);
      __result.iter._M_node = in_stack_fffffffffffffb30._M_node;
      __result.container =
           (set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
            *)in_stack_fffffffffffffb28;
      local_308 = iVar11;
      iVar11 = std::
               set_difference<__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,std::insert_iterator<std::set<std::pair<N*,N*>,std::less<std::pair<N*,N*>>,std::allocator<std::pair<N*,N*>>>>>
                         (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                          (pair<N_*,_N_*> *)iVar12.container,(pair<N_*,_N_*> *)iVar12.iter._M_node,
                          __result);
      _Var10 = iVar11.iter._M_node;
      in_stack_fffffffffffffb48._M_current = (pair<N_*,_N_*> *)(local_1b8 + 0x60);
      local_320 = iVar11;
      local_328 = (pair<N_*,_N_*> *)
                  std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::begin
                            ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                             in_stack_fffffffffffffae8);
      local_330 = (pair<N_*,_N_*> *)
                  std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::end
                            ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                             in_stack_fffffffffffffae8);
      in_stack_fffffffffffffb50._M_current = &local_140;
      local_338 = (pair<N_*,_N_*> *)
                  std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::begin
                            ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                             in_stack_fffffffffffffae8);
      local_340 = (pair<N_*,_N_*> *)
                  std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::end
                            ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                             in_stack_fffffffffffffae8);
      in_stack_fffffffffffffb58 = (N *)local_1b8;
      local_358 = (_Base_ptr)
                  std::
                  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                  ::begin((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                           *)in_stack_fffffffffffffae8);
      iVar11 = std::
               inserter<std::set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>_>
                         ((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                           *)in_stack_fffffffffffffae8,in_stack_fffffffffffffaf0);
      __result_00.iter._M_node = in_stack_fffffffffffffb30._M_node;
      __result_00.container =
           (set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
            *)in_stack_fffffffffffffb28;
      local_350 = iVar11;
      iVar12 = std::
               set_difference<__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,std::insert_iterator<std::set<std::pair<N*,N*>,std::less<std::pair<N*,N*>>,std::allocator<std::pair<N*,N*>>>>>
                         (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                          (pair<N_*,_N_*> *)iVar12.container,(pair<N_*,_N_*> *)iVar12.iter._M_node,
                          __result_00);
      local_370 = local_1b8 + 0x30;
      local_368 = iVar12;
      local_378._M_node =
           (_Base_ptr)
           std::
           set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
           ::begin((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                    *)in_stack_fffffffffffffae8);
      local_380._M_node =
           (_Base_ptr)
           std::
           set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
           ::end((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                  *)in_stack_fffffffffffffae8);
      while( true ) {
        bVar3 = std::operator==(&local_378,&local_380);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        ppVar9 = std::_Rb_tree_const_iterator<std::pair<N_*,_N_*>_>::operator*
                           ((_Rb_tree_const_iterator<std::pair<N_*,_N_*>_> *)0x199949);
        local_398 = ppVar9->first;
        pNStack_390 = ppVar9->second;
        local_3a0 = std::get<0ul,N*,N*>((pair<N_*,_N_*> *)0x199966);
        local_3a8 = std::get<1ul,N*,N*>((pair<N_*,_N_*> *)0x199978);
        in_stack_fffffffffffffb28 = *local_3a0;
        in_stack_fffffffffffffb30._M_node =
             (_Base_ptr)
             std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
             operator[](in_stack_fffffffffffffb30._M_node,(key_type *)in_stack_fffffffffffffb28);
        ppNVar8 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                  operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                              *)in_stack_fffffffffffffb30._M_node,
                             (key_type *)in_stack_fffffffffffffb28);
        local_3c0 = *ppNVar8;
        local_3b8 = &local_3c0;
        local_3b0 = 1;
        ns._M_len = (size_type)_Var10._M_node;
        ns._M_array = (iterator)iVar11.container;
        N::disconnect((N *)iVar11.iter._M_node._M_node,in_stack_fffffffffffffb58,ns);
        std::_Rb_tree_const_iterator<std::pair<N_*,_N_*>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<N_*,_N_*>_> *)
                   in_stack_fffffffffffffaf0._M_node);
      }
      local_3c8 = local_1b8;
      local_3d0._M_node =
           (_Base_ptr)
           std::
           set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
           ::begin((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                    *)in_stack_fffffffffffffae8);
      local_3d8._M_node =
           (_Base_ptr)
           std::
           set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
           ::end((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
                  *)in_stack_fffffffffffffae8);
      while( true ) {
        bVar3 = std::operator==(&local_3d0,&local_3d8);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        ppVar9 = std::_Rb_tree_const_iterator<std::pair<N_*,_N_*>_>::operator*
                           ((_Rb_tree_const_iterator<std::pair<N_*,_N_*>_> *)0x199a9d);
        local_3e8 = ppVar9->first;
        pNStack_3e0 = ppVar9->second;
        in_stack_fffffffffffffaf0._M_node = (_Base_ptr)&local_3e8;
        local_3f0 = std::get<0ul,N*,N*>((pair<N_*,_N_*> *)0x199aba);
        local_3f8 = std::get<1ul,N*,N*>((pair<N_*,_N_*> *)0x199acc);
        in_stack_fffffffffffffaf8 = *local_118;
        in_stack_fffffffffffffb00 = *local_3f0;
        std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::operator[]
                  ((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *)
                   in_stack_fffffffffffffb30._M_node,(key_type *)in_stack_fffffffffffffb28);
        in_stack_fffffffffffffae8 =
             (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)
             std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
             operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *
                        )in_stack_fffffffffffffb30._M_node,(key_type *)in_stack_fffffffffffffb28);
        local_410 = *(mapped_type *)&((_Rep_type *)&in_stack_fffffffffffffae8->_start)->_M_impl;
        local_408 = (sockaddr *)&local_410;
        local_400 = 1;
        N::connect(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffb00,local_408,1);
        std::_Rb_tree_const_iterator<std::pair<N_*,_N_*>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<N_*,_N_*>_> *)
                   in_stack_fffffffffffffaf0._M_node);
      }
      std::
      set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
      ::~set((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
              *)0x199b95);
      std::
      set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
      ::~set((set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
              *)0x199ba2);
      std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::~vector
                ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                 in_stack_fffffffffffffb00);
      std::vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_>::~vector
                ((vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> *)
                 in_stack_fffffffffffffb00);
    }
    std::_Rb_tree_iterator<std::pair<N_*const,_N_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<N_*const,_N_*>_> *)in_stack_fffffffffffffaf0._M_node);
  } while( true );
}

Assistant:

void apply_mapping(NS* base, std::map<N*, N*>& base_to_template) {
    std::map<N*, N*> template_to_base;
    for (auto&& p : base_to_template)
        template_to_base[p.second] = p.first;


    std::map<N*, N*> nested_to_template;
    for (auto [template_n, base_n] : base_to_template) {
        if (NS** g = std::get_if<NS*>(&template_n->data)) {
            if ((*g)->_os.size() == 1){
                nested_to_template[(*g)->_os[0]] = template_n;
            }
        }
    }


    for (auto [template_n, base_n] : base_to_template) {
        if (NS** g = std::get_if<NS*>(&template_n->data)) {
            if ((*g)->_os.size() != 1) throw std::runtime_error("Node creation/deletion in rewriting is not yet implemented");
            N* nested_n = (*g)->_os[0];
            std::vector<std::pair<N*, N*>> template_connections, nested_connections;
            std::set<std::pair<N*, N*>> deleted, added;
            for (N* p : template_n->ps) for (N* o : (*template_n)[p]) template_connections.emplace_back(p, o);
            for (N* p : nested_n->ps) for (N* o : (*nested_n)[p]) nested_connections.emplace_back(p, o);
            std::set_difference(template_connections.begin(), template_connections.end(), nested_connections.begin(), nested_connections.end(), std::inserter(deleted, deleted.begin()));
            std::set_difference(nested_connections.begin(), nested_connections.end(), template_connections.begin(), template_connections.end(), std::inserter(added, added.begin()));
            //for (auto [p, o] : deleted) std::cout << "delete " << *base_n << " |" << *p << "> " << *o << std::endl;
            for (auto [p, o] : deleted) base_n->disconnect(p, {template_to_base[nested_to_template[o]]});
            for (auto [p, o] : added) base_n->connect(p, {template_to_base[nested_to_template[o]]});
        }
    }
}